

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dynhds.c
# Opt level: O1

void Curl_dynhds_free(dynhds *dynhds)

{
  ulong uVar1;
  
  if (((dynhds->hds != (dynhds_entry **)0x0) && (dynhds->hds_len != 0)) && (dynhds->hds_len != 0)) {
    uVar1 = 0;
    do {
      (*Curl_cfree)(dynhds->hds[uVar1]);
      uVar1 = uVar1 + 1;
    } while (uVar1 < dynhds->hds_len);
  }
  (*Curl_cfree)(dynhds->hds);
  dynhds->strs_len = 0;
  dynhds->hds = (dynhds_entry **)0x0;
  dynhds->hds_len = 0;
  dynhds->hds_allc = 0;
  return;
}

Assistant:

void Curl_dynhds_free(struct dynhds *dynhds)
{
  DEBUGASSERT(dynhds);
  if(dynhds->hds && dynhds->hds_len) {
    size_t i;
    DEBUGASSERT(dynhds->hds);
    for(i = 0; i < dynhds->hds_len; ++i) {
      entry_free(dynhds->hds[i]);
    }
  }
  Curl_safefree(dynhds->hds);
  dynhds->hds_len = dynhds->hds_allc = dynhds->strs_len = 0;
}